

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O1

void QtMWidgets::drawSliderHandle
               (QPainter *p,QRect *r,int xRadius,int yRadius,QColor *borderColor,QColor *lightColor)

{
  QColor QVar1;
  QLinearGradient g;
  QPointF local_b8;
  double local_a8;
  double local_a0;
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  QPointF local_40;
  
  QPainter::setPen((QColor *)p);
  QBrush::QBrush((QBrush *)local_98,lightColor,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)local_98);
  local_98._0_8_ = (undefined8)r->x1;
  local_98._8_8_ = (undefined8)r->y1;
  local_88 = (double)((r->x2 - r->x1) + 1);
  local_80 = (double)((r->y2 - r->y1) + 1);
  QPainter::drawRoundedRect((QRectF *)p,(double)xRadius,(double)yRadius,(SizeMode)local_98);
  local_b8.xp = 0.0;
  local_b8.yp = 0.0;
  local_40.xp = 0.0;
  local_40.yp = 1.0;
  QLinearGradient::QLinearGradient((QLinearGradient *)local_98,&local_b8,&local_40);
  QGradient::setCoordinateMode((CoordinateMode)(QLinearGradient *)local_98);
  QVar1 = darkerColor(lightColor,0x4b);
  local_b8.xp = QVar1._0_8_;
  local_b8.yp._0_6_ = QVar1.ct._4_6_;
  QGradient::setColorAt(0.0,(QColor *)local_98);
  QVar1 = darkerColor(lightColor,10);
  local_b8.xp = QVar1._0_8_;
  local_b8.yp._0_6_ = QVar1.ct._4_6_;
  QGradient::setColorAt(1.0,(QColor *)local_98);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&local_b8,(QGradient *)local_98);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_b8);
  local_b8.xp = (qreal)(r->x1 + 2);
  local_b8.yp = (qreal)(r->y1 + 2);
  local_a8 = (double)((r->x2 - r->x1) + -3);
  local_a0 = (double)((r->y2 - r->y1) + -3);
  QPainter::drawRoundedRect
            ((QRectF *)p,(double)(xRadius + -4),(double)(yRadius + -4),(SizeMode)&local_b8);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_98);
  return;
}

Assistant:

void drawSliderHandle( QPainter * p, const QRect & r,
	int xRadius, int yRadius, const QColor & borderColor,
	const QColor & lightColor )
{
	p->setPen( borderColor );
	p->setBrush( lightColor );
	p->drawRoundedRect( r, xRadius, yRadius );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );
	g.setColorAt( 0.0, darkerColor( lightColor, 75 ) );
	g.setColorAt( 1.0, darkerColor( lightColor, 10 ) );

	p->setPen( Qt::NoPen );
	p->setBrush( g );

	p->drawRoundedRect( r.marginsRemoved( QMargins( 2, 2, 2, 2 ) ),
		xRadius - 4, yRadius - 4 );
}